

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.h
# Opt level: O2

void __thiscall
miniros::Subscription::PendingConnection::~PendingConnection(PendingConnection *this)

{
  (this->super_ASyncXMLRPCConnection)._vptr_ASyncXMLRPCConnection =
       (_func_int **)&PTR__PendingConnection_002f1d48;
  if (this->client_ != (XmlRpcClient *)0x0) {
    (*(this->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
  }
  std::__cxx11::string::~string((string *)&this->remote_uri_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->parent_).super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->udp_transport_).
              super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_ASyncXMLRPCConnection).
              super_enable_shared_from_this<miniros::ASyncXMLRPCConnection>._M_weak_this.
              super___weak_ptr<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~PendingConnection()
      {
        delete client_;
      }